

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_google_units.cpp
# Opt level: O3

void __thiscall googleUnits_unitTypes_Test::TestBody(googleUnits_unitTypes_Test *this)

{
  char cVar1;
  int iVar2;
  istream *piVar3;
  char *in_R9;
  bool bVar4;
  double dVar5;
  precise_unit pVar6;
  string utype;
  string tp;
  ifstream tfile;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2e0;
  internal local_2d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0;
  long *local_2c8;
  long local_2c0;
  long local_2b8 [2];
  double local_2a8;
  string local_2a0;
  AssertHelper local_280;
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  string local_258;
  long local_238 [65];
  
  std::ifstream::ifstream
            ((istream *)local_238,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/google_defined_units.txt"
             ,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    local_278 = &local_268;
    local_270 = 0;
    local_268 = 0;
    while( true ) {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_278,cVar1);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::string::find((char)(string *)&local_278,0x3a);
      std::__cxx11::string::substr((ulong)&local_2c8,(ulong)&local_278);
      iVar2 = std::__cxx11::string::compare((char *)&local_2c8);
      if (iVar2 != 0) {
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_258,local_2c8,(long)local_2c8 + local_2c0);
        pVar6 = units::default_unit(&local_258);
        dVar5 = pVar6.multiplier_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          local_2a8 = pVar6.multiplier_;
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          dVar5 = local_2a8;
        }
        bVar4 = pVar6.base_units_ != (unit_data)0xfa94a488;
        local_2d8[0] = (internal)(bVar4 || !NAN(dVar5));
        local_2d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!bVar4 && NAN(dVar5)) {
          testing::Message::Message((Message *)&local_2e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_2e0._M_head_impl + 0x10),(char *)local_2c8,local_2c0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_2e0._M_head_impl + 0x10),
                     " does not produce a valid default unit",0x26);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_2a0,local_2d8,(AssertionResult *)"is_valid(bunit)","false","true",in_R9)
          ;
          testing::internal::AssertHelper::AssertHelper
                    (&local_280,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_google_units.cpp"
                     ,0x1f,local_2a0._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_2e0);
          testing::internal::AssertHelper::~AssertHelper(&local_280);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
          }
          if (local_2e0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_2e0._M_head_impl + 8))();
          }
          if (local_2d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_2d0,local_2d0);
          }
        }
      }
      if (local_2c8 != local_2b8) {
        operator_delete(local_2c8,local_2b8[0] + 1);
      }
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
    }
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

TEST(googleUnits, unitTypes)
{
    std::ifstream tfile(TEST_FILE_FOLDER "/google_defined_units.txt");
    if (tfile.is_open()) {  // checking whether the file is open
        std::string tp;
        while (std::getline(tfile, tp)) {  // read data from file object and put
                                           // it into string.
            auto cloc = tp.find_first_of(':');
            std::string utype = tp.substr(0, cloc);
            if (utype == "Misc") {
                continue;
            }
            auto bunit = units::default_unit(utype);
            EXPECT_TRUE(is_valid(bunit))
                << utype << " does not produce a valid default unit";
        }
    }
}